

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O0

uint * RDL_listFamilies(RDL_data *data,uint object,char mode,char family)

{
  uint uVar1;
  bool bVar2;
  void *__ptr;
  uint *puVar3;
  bool bVar4;
  code *local_58;
  _func_uint_ptr_RDL_data_ptr_uint_char *giveFamily;
  char can_be_contained;
  char contained;
  uint urf_index;
  uint target_bcc;
  uint bcc_index;
  uint j;
  uint i;
  uint *objects;
  uint local_28;
  uint alloced;
  uint nextfree;
  uint nof_families;
  uint *result;
  char family_local;
  char mode_local;
  uint object_local;
  RDL_data *data_local;
  
  local_28 = 0;
  objects._4_4_ = 0x40;
  if ((mode != 'a') && (mode != 'b')) {
    (*RDL_outputFunc)(RDL_ERROR,"tried to call \'RDL_listFamilies()\' with invalid mode \'%c\'\n",
                      (ulong)(uint)(int)mode);
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                  ,0x385,
                  "unsigned int *RDL_listFamilies(const RDL_data *, unsigned int, char, char)");
  }
  if (family == 'u') {
    alloced = data->nofURFs;
    local_58 = RDL_giveURF;
  }
  else {
    if (family != 'r') {
      (*RDL_outputFunc)(RDL_ERROR,
                        "tried to call \'RDL_listFamilies()\' with invalid family \'%c\'\n",
                        (ulong)(uint)(int)family);
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rareylab[P]RingDecomposerLib/src/RingDecomposerLib/RingDecomposerLib.c"
                    ,0x396,
                    "unsigned int *RDL_listFamilies(const RDL_data *, unsigned int, char, char)");
    }
    alloced = data->nofRCFs;
    local_58 = RDL_giveRCF;
  }
  _nextfree = malloc(0x100);
  bcc_index = 0;
  do {
    if (alloced <= bcc_index) {
      puVar3 = (uint *)realloc(_nextfree,(ulong)(local_28 + 1) << 2);
      puVar3[local_28] = 0xffffffff;
      return puVar3;
    }
    if (family == 'u') {
      giveFamily._4_4_ = bcc_index;
    }
    else if (family == 'r') {
      giveFamily._4_4_ = data->rcf_to_urf[bcc_index][0];
    }
    uVar1 = data->urf_to_bcc[giveFamily._4_4_][0];
    bVar4 = false;
    if (mode == 'a') {
      for (target_bcc = 0; target_bcc < data->bccGraphs->nof_bcc_per_node[object];
          target_bcc = target_bcc + 1) {
        if (data->bccGraphs->node_to_bcc_mapping[object][target_bcc << 1] == uVar1) {
          bVar4 = true;
          break;
        }
      }
    }
    else {
      bVar4 = *data->bccGraphs->edge_to_bcc_mapping[object] == uVar1;
    }
    bVar2 = false;
    if (bVar4) {
      __ptr = (void *)(*local_58)(data,bcc_index,(int)mode);
      target_bcc = 0;
      while (*(int *)((long)__ptr + (ulong)target_bcc * 4) != -1) {
        if (*(uint *)((long)__ptr + (ulong)target_bcc * 4) == object) {
          bVar2 = true;
          break;
        }
        target_bcc = target_bcc + 1;
      }
      free(__ptr);
    }
    if (bVar2) {
      if (local_28 == objects._4_4_) {
        objects._4_4_ = objects._4_4_ << 1;
        _nextfree = realloc(_nextfree,(ulong)objects._4_4_ << 2);
      }
      *(uint *)((long)_nextfree + (ulong)local_28 * 4) = bcc_index;
      local_28 = local_28 + 1;
    }
    bcc_index = bcc_index + 1;
  } while( true );
}

Assistant:

static unsigned *RDL_listFamilies(const RDL_data *data, unsigned object,
    char mode, char family)
{
  unsigned *result;
  unsigned nof_families;
  unsigned nextfree=0, alloced=RDL_RESERVED_START;
  unsigned *objects;
  unsigned i,j, bcc_index, target_bcc, urf_index;
  char contained, can_be_contained;

  if(!(mode == 'a' || mode == 'b'))
  {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_listFamilies()' with invalid mode '%c'\n",mode);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  unsigned* (*giveFamily) (const RDL_data*, unsigned, char) = NULL;

  if (family == 'u') {
    nof_families = data->nofURFs;
    giveFamily = RDL_giveURF;
  }
  else if (family == 'r') {
    nof_families = data->nofRCFs;
    giveFamily = RDL_giveRCF;
  }
  else {
    RDL_outputFunc(RDL_ERROR, "tried to call 'RDL_listFamilies()' with invalid family '%c'\n",family);
    /* cannot occur when using interface */
    assert(0);
    return NULL;
  }

  result=malloc(alloced * sizeof(*result));
  for(i = 0; i < nof_families; ++i)
  {
    if (family == 'u') {
      urf_index = i;
    }
    else if (family == 'r') {
      urf_index = data->rcf_to_urf[i][0];
    }

    bcc_index = data->urf_to_bcc[urf_index][0];

    /*
     * check if object belongs to this BCC at all,
     * if not it can't be in the URF either
     */
    can_be_contained = 0;
    if (mode == 'a') {
      for (j = 0; j < data->bccGraphs->nof_bcc_per_node[object]; ++j) {
        target_bcc = data->bccGraphs->node_to_bcc_mapping[object][2*j];
        if (target_bcc == bcc_index) {
          can_be_contained = 1;
          break;
        }
      }
    }
    else {
      target_bcc = data->bccGraphs->edge_to_bcc_mapping[object][0];
      if (target_bcc == bcc_index) {
        can_be_contained = 1;
      }
    }

    contained = 0;
    if (can_be_contained) {
      objects = giveFamily(data, i, mode);
      for(j=0; objects[j]<UINT_MAX; ++j)
      {
        if(objects[j] == object)
        {
          contained = 1;
          break;
        }
      }
      free(objects);
    }
    if (contained) {
      if(nextfree == alloced) {
        alloced *= 2;
        result = realloc(result, alloced*sizeof(*result));
      }
      result[nextfree++] = i;
    }
  }

  result = realloc(result, (nextfree+1)*sizeof(*result));
  result[nextfree] = UINT_MAX;
  return result;
}